

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

void __thiscall
chrono::robosimian::RS_Part::RS_Part
          (RS_Part *this,string *name,shared_ptr<chrono::ChMaterialSurface> *mat,ChSystem *system)

{
  ChBodyAuxRef *__p;
  element_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [32];
  shared_ptr<chrono::ChBodyAuxRef> local_48 [2];
  ChSystem *local_28;
  ChSystem *system_local;
  shared_ptr<chrono::ChMaterialSurface> *mat_local;
  string *name_local;
  RS_Part *this_local;
  
  this->_vptr_RS_Part = (_func_int **)&PTR__RS_Part_002ed880;
  local_28 = system;
  system_local = (ChSystem *)mat;
  mat_local = (shared_ptr<chrono::ChMaterialSurface> *)name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr(&this->m_body);
  std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr(&this->m_mat,mat);
  std::vector<chrono::robosimian::BoxShape,_std::allocator<chrono::robosimian::BoxShape>_>::vector
            (&this->m_boxes);
  std::vector<chrono::robosimian::SphereShape,_std::allocator<chrono::robosimian::SphereShape>_>::
  vector(&this->m_spheres);
  std::vector<chrono::robosimian::CylinderShape,_std::allocator<chrono::robosimian::CylinderShape>_>
  ::vector(&this->m_cylinders);
  std::vector<chrono::robosimian::MeshShape,_std::allocator<chrono::robosimian::MeshShape>_>::vector
            (&this->m_meshes);
  std::__cxx11::string::string((string *)&this->m_mesh_name);
  ChVector<double>::ChVector(&this->m_offset);
  ChColor::ChColor(&this->m_color);
  __p = (ChBodyAuxRef *)(**(code **)(*(long *)local_28 + 0x188))();
  std::shared_ptr<chrono::ChBodyAuxRef>::shared_ptr<chrono::ChBodyAuxRef,void>(local_48,__p);
  std::shared_ptr<chrono::ChBodyAuxRef>::operator=(&this->m_body,local_48);
  std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr(local_48);
  this_00 = std::__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_body);
  std::operator+(local_68,(char *)mat_local);
  ChObj::SetNameString((ChObj *)this_00,local_68);
  std::__cxx11::string::~string((string *)local_68);
  return;
}

Assistant:

RS_Part::RS_Part(const std::string& name, std::shared_ptr<ChMaterialSurface> mat, ChSystem* system)
    : m_name(name), m_mat(mat) {
    m_body = std::shared_ptr<ChBodyAuxRef>(system->NewBodyAuxRef());
    m_body->SetNameString(name + "_body");
}